

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallTargetGenerator::AddInstallNamePatchRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,
          string *toDestDirPath)

{
  pointer pcVar1;
  cmGeneratorTarget *pcVar2;
  cmInstallTargetGenerator *pcVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  TargetType TVar6;
  int iVar7;
  cmMakefile *this_00;
  string *psVar8;
  cmComputeLinkInformation *this_01;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *psVar9;
  mapped_type *pmVar10;
  _Rb_tree_node_base *p_Var11;
  ostream *poVar12;
  Indent IVar13;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string fname;
  string new_id;
  string for_build;
  string installNameTool;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  install_name_remap;
  string for_install_1;
  string local_150;
  cmInstallTargetGenerator *local_130;
  string local_128;
  string local_108;
  long *local_e8;
  long local_e0;
  long local_d8 [2];
  undefined1 local_c8 [32];
  _Rb_tree_node_base *local_a8;
  size_t local_a0;
  string *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->ImportLibrary == false) &&
     (((local_98 = toDestDirPath, TVar6 = cmGeneratorTarget::GetType(this->Target),
       TVar6 == SHARED_LIBRARY ||
       (TVar6 = cmGeneratorTarget::GetType(this->Target), TVar6 == MODULE_LIBRARY)) ||
      (TVar6 = cmGeneratorTarget::GetType(this->Target), TVar6 == EXECUTABLE)))) {
    local_130 = this;
    this_00 = cmTarget::GetMakefile(this->Target->Target);
    local_c8._0_8_ = local_c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"CMAKE_INSTALL_NAME_TOOL","")
    ;
    psVar8 = cmMakefile::GetSafeDefinition(this_00,(string *)local_c8);
    local_e8 = local_d8;
    pcVar1 = (psVar8->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar1,pcVar1 + psVar8->_M_string_length);
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    if (local_e0 != 0) {
      local_c8._24_8_ = local_c8 + 8;
      local_c8._8_4_ = _S_red;
      local_c8._16_8_ = 0;
      local_a0 = 0;
      local_a8 = (_Rb_tree_node_base *)local_c8._24_8_;
      this_01 = cmGeneratorTarget::GetLinkInformation(local_130->Target,config);
      if (this_01 != (cmComputeLinkInformation *)0x0) {
        psVar9 = cmComputeLinkInformation::GetSharedLibrariesLinked(this_01);
        for (p_Var11 = (psVar9->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var11 != &(psVar9->_M_t)._M_impl.super__Rb_tree_header;
            p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
          pcVar2 = *(cmGeneratorTarget **)(p_Var11 + 1);
          bVar5 = cmGeneratorTarget::IsImported(pcVar2);
          if (!bVar5) {
            cmGeneratorTarget::GetInstallNameDirForBuildTree(&local_108,pcVar2,config);
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_150,"${CMAKE_INSTALL_PREFIX}","");
            cmGeneratorTarget::GetInstallNameDirForInstallTree(&local_128,pcVar2,config,&local_150);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != &local_150.field_2) {
              operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1
                             );
            }
            if ((local_108._M_string_length != local_128._M_string_length) ||
               (((pointer)local_108._M_string_length != (pointer)0x0 &&
                (iVar7 = bcmp(local_108._M_dataplus._M_p,local_128._M_dataplus._M_p,
                              local_108._M_string_length), iVar7 != 0)))) {
              GetInstallFilename(&local_150,pcVar2,config,NameSO);
              std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_150._M_dataplus._M_p);
              std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_150._M_dataplus._M_p);
              pmVar10 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)local_c8,&local_108);
              std::__cxx11::string::_M_assign((string *)pmVar10);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_150._M_dataplus._M_p != &local_150.field_2) {
                operator_delete(local_150._M_dataplus._M_p,
                                local_150.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,
                              CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                                       local_128.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._M_dataplus._M_p != &local_108.field_2) {
              operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
      }
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      local_128._M_string_length = 0;
      local_128.field_2._M_local_buf[0] = '\0';
      TVar6 = cmGeneratorTarget::GetType(local_130->Target);
      pcVar3 = local_130;
      if (TVar6 == SHARED_LIBRARY) {
        cmGeneratorTarget::GetInstallNameDirForBuildTree(&local_150,local_130->Target,config);
        pcVar2 = pcVar3->Target;
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,"${CMAKE_INSTALL_PREFIX}","");
        cmGeneratorTarget::GetInstallNameDirForInstallTree(&local_90,pcVar2,config,&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        cmGeneratorTarget::IsFrameworkOnApple(local_130->Target);
        if ((local_150._M_string_length != local_90._M_string_length) ||
           (((undefined1 *)local_150._M_string_length != (undefined1 *)0x0 &&
            (iVar7 = bcmp(local_150._M_dataplus._M_p,local_90._M_dataplus._M_p,
                          local_150._M_string_length), iVar7 != 0)))) {
          _Var4._M_p = local_90._M_dataplus._M_p;
          GetInstallFilename(&local_70,local_130->Target,config,NameSO);
          local_108._M_dataplus._M_p = (pointer)local_90._M_string_length;
          local_108._M_string_length = (size_type)_Var4._M_p;
          local_108.field_2._M_allocated_capacity = local_70._M_string_length;
          local_108.field_2._8_8_ = local_70._M_dataplus._M_p;
          views._M_len = 2;
          views._M_array = (iterator)&local_108;
          cmCatViews_abi_cxx11_(&local_50,views);
          std::__cxx11::string::operator=((string *)&local_128,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_a0 != 0 || (pointer)local_128._M_string_length != (pointer)0x0) {
        IVar13.Level = indent.Level;
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            IVar13.Level = IVar13.Level + -1;
          } while (IVar13.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"execute_process(COMMAND \"",0x19);
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_e8,local_e0);
        std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
        if ((pointer)local_128._M_string_length != (pointer)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
          IVar13.Level = indent.Level;
          if (0 < indent.Level) {
            do {
              std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
              IVar13.Level = IVar13.Level + -1;
            } while (IVar13.Level != 0);
          }
          std::__ostream_insert<char,std::char_traits<char>>(os,"  -id \"",7);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              (os,local_128._M_dataplus._M_p,local_128._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\"",1);
        }
        p_Var11 = (_Rb_tree_node_base *)local_c8._24_8_;
        if ((_Rb_tree_node_base *)local_c8._24_8_ != (_Rb_tree_node_base *)(local_c8 + 8)) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
            IVar13.Level = indent.Level;
            if (0 < indent.Level) {
              do {
                std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
                IVar13.Level = IVar13.Level + -1;
              } while (IVar13.Level != 0);
            }
            std::__ostream_insert<char,std::char_traits<char>>(os,"  -change \"",0xb);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (os,*(char **)(p_Var11 + 1),(long)p_Var11[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\" \"",3);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,*(char **)(p_Var11 + 2),(long)p_Var11[2]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\"",1);
            p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
          } while (p_Var11 != (_Rb_tree_node_base *)(local_c8 + 8));
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            indent.Level = indent.Level + -1;
          } while (indent.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"  \"",3);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (os,(local_98->_M_dataplus)._M_p,local_98->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\")\n",3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,
                        CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                                 local_128.field_2._M_local_buf[0]) + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_c8);
    }
    if (local_e8 != local_d8) {
      operator_delete(local_e8,local_d8[0] + 1);
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddInstallNamePatchRule(
  std::ostream& os, Indent indent, const std::string& config,
  std::string const& toDestDirPath)
{
  if (this->ImportLibrary ||
      !(this->Target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->Target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        this->Target->GetType() == cmStateEnums::EXECUTABLE)) {
    return;
  }

  // Fix the install_name settings in installed binaries.
  std::string installNameTool =
    this->Target->Target->GetMakefile()->GetSafeDefinition(
      "CMAKE_INSTALL_NAME_TOOL");

  if (installNameTool.empty()) {
    return;
  }

  // Build a map of build-tree install_name to install-tree install_name for
  // shared libraries linked to this target.
  std::map<std::string, std::string> install_name_remap;
  if (cmComputeLinkInformation* cli =
        this->Target->GetLinkInformation(config)) {
    std::set<cmGeneratorTarget const*> const& sharedLibs =
      cli->GetSharedLibrariesLinked();
    for (cmGeneratorTarget const* tgt : sharedLibs) {
      // The install_name of an imported target does not change.
      if (tgt->IsImported()) {
        continue;
      }

      // If the build tree and install tree use different path
      // components of the install_name field then we need to create a
      // mapping to be applied after installation.
      std::string for_build = tgt->GetInstallNameDirForBuildTree(config);
      std::string for_install = tgt->GetInstallNameDirForInstallTree(
        config, "${CMAKE_INSTALL_PREFIX}");
      if (for_build != for_install) {
        // The directory portions differ.  Append the filename to
        // create the mapping.
        std::string fname = this->GetInstallFilename(tgt, config, NameSO);

        // Map from the build-tree install_name.
        for_build += fname;

        // Map to the install-tree install_name.
        for_install += fname;

        // Store the mapping entry.
        install_name_remap[for_build] = for_install;
      }
    }
  }

  // Edit the install_name of the target itself if necessary.
  std::string new_id;
  if (this->Target->GetType() == cmStateEnums::SHARED_LIBRARY) {
    std::string for_build =
      this->Target->GetInstallNameDirForBuildTree(config);
    std::string for_install = this->Target->GetInstallNameDirForInstallTree(
      config, "${CMAKE_INSTALL_PREFIX}");

    if (this->Target->IsFrameworkOnApple() && for_install.empty()) {
      // Frameworks seem to have an id corresponding to their own full
      // path.
      // ...
      // for_install = fullDestPath_without_DESTDIR_or_name;
    }

    // If the install name will change on installation set the new id
    // on the installed file.
    if (for_build != for_install) {
      // Prepare to refer to the install-tree install_name.
      new_id = cmStrCat(
        for_install, this->GetInstallFilename(this->Target, config, NameSO));
    }
  }

  // Write a rule to run install_name_tool to set the install-tree
  // install_name value and references.
  if (!new_id.empty() || !install_name_remap.empty()) {
    os << indent << "execute_process(COMMAND \"" << installNameTool;
    os << "\"";
    if (!new_id.empty()) {
      os << "\n" << indent << "  -id \"" << new_id << "\"";
    }
    for (auto const& i : install_name_remap) {
      os << "\n"
         << indent << "  -change \"" << i.first << "\" \"" << i.second << "\"";
    }
    os << "\n" << indent << "  \"" << toDestDirPath << "\")\n";
  }
}